

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O1

void udata_writePadding(UNewDataMemory *pData,int32_t length)

{
  bool bVar1;
  int len;
  
  if ((pData != (UNewDataMemory *)0x0) && (pData->file != (FileStream *)0x0)) {
    len = length;
    if (0xf < length) {
      do {
        T_FileStream_write(pData->file,udata_writePadding::padding,0x10);
        len = length + -0x10;
        bVar1 = 0x1f < length;
        length = len;
      } while (bVar1);
    }
    if (0 < len) {
      T_FileStream_write(pData->file,udata_writePadding::padding,len);
      return;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_writePadding(UNewDataMemory *pData, int32_t length) {
    static const uint8_t padding[16]={
        0xaa, 0xaa, 0xaa, 0xaa,
        0xaa, 0xaa, 0xaa, 0xaa,
        0xaa, 0xaa, 0xaa, 0xaa,
        0xaa, 0xaa, 0xaa, 0xaa
    };
    if(pData!=NULL && pData->file!=NULL) {
        while(length>=16) {
            T_FileStream_write(pData->file, padding, 16);
            length-=16;
        }
        if(length>0) {
            T_FileStream_write(pData->file, padding, length);
        }
    }
}